

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::addSourceTarget
          (CommonCore *this,InterfaceHandle handle,string_view targetName,InterfaceType hint)

{
  byte bVar1;
  ushort uVar2;
  undefined8 *puVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var6;
  InvalidIdentifier *this_00;
  HelicsException *this_01;
  char *pcVar7;
  size_t sVar8;
  action_t newAction;
  string_view string1;
  string_view message;
  string_view message_00;
  string_view string2;
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined8 local_c8;
  Time TStack_c0;
  Time local_b8;
  Time TStack_b0;
  Time local_a8;
  SmallBuffer SStack_a0;
  pointer pbStack_40;
  pointer local_38;
  pointer pbStack_30;
  
  sVar8 = targetName._M_len;
  p_Var6 = getHandleInfo(this,handle);
  if (p_Var6 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "invalid handle";
    sVar8 = 0xe;
LAB_002a1650:
    message._M_str = pcVar7;
    message._M_len = sVar8;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  uVar2 = *(ushort *)
           ((long)&(p_Var6->
                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                   ._M_storage._M_storage + 6);
  if ((uVar2 >> 0xd & 1) != 0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "Interface is receive only and cannot have destination targets";
    sVar8 = 0x3d;
    goto LAB_002a1650;
  }
  SStack_a0.heap = local_e0 + 0x40;
  local_e0._0_4_ = cmd_ignore;
  local_e0._4_4_ = 0;
  local_d0._0_4_ = 0;
  local_d0._4_4_ = -1700000000;
  TStack_c0.internalTimeCode = 0;
  local_b8.internalTimeCode = 0;
  TStack_b0.internalTimeCode = 0;
  local_a8.internalTimeCode = 0;
  SStack_a0.buffer._M_elems[0] = 0;
  SStack_a0.buffer._M_elems[1] = 0;
  SStack_a0.buffer._M_elems[2] = 0;
  SStack_a0.buffer._M_elems[3] = 0;
  SStack_a0.buffer._M_elems[4] = 0;
  SStack_a0.buffer._M_elems[5] = 0;
  SStack_a0.buffer._M_elems[6] = 0;
  SStack_a0.buffer._M_elems[7] = 0;
  SStack_a0.buffer._M_elems[8] = 0;
  SStack_a0.buffer._M_elems[9] = 0;
  SStack_a0.buffer._M_elems[10] = 0;
  SStack_a0.buffer._M_elems[0xb] = 0;
  SStack_a0.buffer._M_elems[0xc] = 0;
  SStack_a0.buffer._M_elems[0xd] = 0;
  SStack_a0.buffer._M_elems[0xe] = 0;
  SStack_a0.buffer._M_elems[0xf] = 0;
  SStack_a0.buffer._M_elems[0x10] = 0;
  SStack_a0.buffer._M_elems[0x11] = 0;
  SStack_a0.buffer._M_elems[0x12] = 0;
  SStack_a0.buffer._M_elems[0x13] = 0;
  SStack_a0.buffer._M_elems[0x14] = 0;
  SStack_a0.buffer._M_elems[0x15] = 0;
  SStack_a0.buffer._M_elems[0x16] = 0;
  SStack_a0.buffer._M_elems[0x17] = 0;
  SStack_a0.buffer._M_elems[0x18] = 0;
  SStack_a0.buffer._M_elems[0x19] = 0;
  SStack_a0.buffer._M_elems[0x1a] = 0;
  SStack_a0.buffer._M_elems[0x1b] = 0;
  SStack_a0.buffer._M_elems[0x1c] = 0;
  SStack_a0.buffer._M_elems[0x1d] = 0;
  SStack_a0.buffer._M_elems[0x1e] = 0;
  SStack_a0.buffer._M_elems[0x1f] = 0;
  SStack_a0.buffer._M_elems[0x20] = 0;
  SStack_a0.buffer._M_elems[0x21] = 0;
  SStack_a0.buffer._M_elems[0x22] = 0;
  SStack_a0.buffer._M_elems[0x23] = 0;
  SStack_a0.buffer._M_elems[0x24] = 0;
  SStack_a0.buffer._M_elems[0x25] = 0;
  SStack_a0.buffer._M_elems[0x26] = 0;
  SStack_a0.buffer._M_elems[0x27] = 0;
  SStack_a0.buffer._M_elems[0x28] = 0;
  SStack_a0.buffer._M_elems[0x29] = 0;
  SStack_a0.buffer._M_elems[0x2a] = 0;
  SStack_a0.buffer._M_elems[0x2b] = 0;
  SStack_a0.buffer._M_elems[0x2c] = 0;
  SStack_a0.buffer._M_elems[0x2d] = 0;
  SStack_a0.buffer._M_elems[0x2e] = 0;
  SStack_a0.buffer._M_elems[0x2f] = 0;
  SStack_a0.buffer._M_elems[0x30] = 0;
  SStack_a0.buffer._M_elems[0x31] = 0;
  SStack_a0.buffer._M_elems[0x32] = 0;
  SStack_a0.buffer._M_elems[0x33] = 0;
  SStack_a0.buffer._M_elems[0x34] = 0;
  SStack_a0.buffer._M_elems[0x35] = 0;
  SStack_a0.buffer._M_elems[0x36] = 0;
  SStack_a0.buffer._M_elems[0x37] = 0;
  SStack_a0.buffer._M_elems[0x38] = 0;
  SStack_a0.buffer._M_elems[0x39] = 0;
  SStack_a0.buffer._M_elems[0x3a] = 0;
  SStack_a0.buffer._M_elems[0x3b] = 0;
  SStack_a0.buffer._M_elems[0x3c] = 0;
  SStack_a0.buffer._M_elems[0x3d] = 0;
  SStack_a0.buffer._M_elems[0x3e] = 0;
  SStack_a0.buffer._M_elems[0x3f] = 0;
  SStack_a0.bufferSize = 0;
  SStack_a0.bufferCapacity = 0x40;
  SStack_a0.nonOwning = false;
  SStack_a0.locked = false;
  SStack_a0.usingAllocatedBuffer = false;
  SStack_a0.errorCondition = '\0';
  SStack_a0.userKey = 0;
  pbStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pbStack_30 = (pointer)0x0;
  local_e0._8_8_ = (p_Var6->super__Hash_node_base)._M_nxt;
  local_c8 = (ulong)CONCAT22(uVar2,(short)(char)(p_Var6->
                                                super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                                ).
                                                super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                                ._M_storage._M_storage.__data[4]);
  if (((SmallBuffer *)SStack_a0.heap != (SmallBuffer *)targetName._M_str) &&
     (SmallBuffer::reserve((SmallBuffer *)SStack_a0.heap,sVar8), sVar8 != 0)) {
    SStack_a0.bufferSize = sVar8;
    memcpy(SStack_a0.heap,(SmallBuffer *)targetName._M_str,sVar8);
    sVar8 = SStack_a0.bufferSize;
  }
  SStack_a0.bufferSize = sVar8;
  bVar1 = (p_Var6->
          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
          ._M_storage._M_storage.__data[4];
  if (bVar1 < 0x69) {
    if (bVar1 != 0x65) {
      if (bVar1 == 0x66) {
        ActionMessage::setAction((ActionMessage *)local_e0,cmd_add_named_endpoint);
        if (*(long *)((long)&(p_Var6->
                             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                             ._M_storage._M_storage + 0x10) == 0) {
          puVar3 = (undefined8 *)
                   p_Var6[2].
                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                   .super__Hash_node_code_cache<true>._M_hash_code;
          p_Var4 = p_Var6[3].super__Hash_node_base._M_nxt;
          sVar8 = puVar3[1];
          p_Var5 = p_Var4[1]._M_nxt;
          if (sVar8 != 0 || p_Var5 != (_Hash_node_base *)0x0) {
            string1._M_str = (char *)*puVar3;
            string1._M_len = sVar8;
            string2._M_str = (char *)p_Var4->_M_nxt;
            string2._M_len = (size_t)p_Var5;
            ActionMessage::setStringData((ActionMessage *)local_e0,string1,string2);
          }
        }
        if (((p_Var6->
             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ._M_storage._M_storage.__data[7] & 2) != 0) {
          local_c8 = local_c8 | 0x2000000;
        }
        goto LAB_002a15b6;
      }
LAB_002a166e:
      this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
      pcVar7 = "publications cannot have source targets";
      sVar8 = 0x27;
LAB_002a1687:
      message_00._M_str = pcVar7;
      message_00._M_len = sVar8;
      HelicsException::HelicsException(this_01,message_00);
      *(undefined ***)this_01 = &PTR__HelicsException_004bb1e0;
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
LAB_002a158f:
    newAction = cmd_add_named_filter;
    if (hint != FILTER) {
      newAction = (uint)(hint == PUBLICATION) ^ cmd_add_named_endpoint;
    }
  }
  else {
    newAction = cmd_add_named_publication;
    if (bVar1 == 0x69) goto LAB_002a15a9;
    if (bVar1 == 0x73) goto LAB_002a158f;
    if (bVar1 != 0x74) goto LAB_002a166e;
    if ((char)hint < 'i') {
      if (hint == ENDPOINT) {
        newAction = cmd_add_named_endpoint;
      }
      else {
        if (hint != FILTER) goto LAB_002a15ef;
        newAction = cmd_add_named_filter;
      }
    }
    else if (hint != PUBLICATION) {
      if (hint == INPUT) {
        this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
        pcVar7 = "translators cannot have inputs as a source";
        sVar8 = 0x2a;
        goto LAB_002a1687;
      }
LAB_002a15ef:
      ActionMessage::setAction((ActionMessage *)local_e0,cmd_add_named_publication);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e0);
      newAction = cmd_add_named_endpoint;
    }
  }
LAB_002a15a9:
  ActionMessage::setAction((ActionMessage *)local_e0,newAction);
LAB_002a15b6:
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e0);
  ActionMessage::~ActionMessage((ActionMessage *)local_e0);
  return;
}

Assistant:

void CommonCore::addSourceTarget(InterfaceHandle handle,
                                 std::string_view targetName,
                                 InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, source_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    cmd.flags = handleInfo->flags;
    cmd.payload = targetName;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
        case InterfaceType::SINK:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else if (hint == InterfaceType::PUBLICATION) {
                cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            break;

        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::PUBLICATION:
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    break;

                case InterfaceType::INPUT:
                    throw(InvalidIdentifier("translators cannot have inputs as a source"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators can have two inputs
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            break;
        case InterfaceType::PUBLICATION:
        default:
            throw(InvalidIdentifier("publications cannot have source targets"));
    }
    addActionMessage(std::move(cmd));
}